

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void sga_pack(Integer first,long lim,Integer elems,Integer type_src,Integer type_msk,void *ptr_src,
             void *ptr_dst,void *ptr_msk)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  DoubleComplex *in_RDI;
  long in_R8;
  long in_R9;
  double *pck_46;
  DoubleComplex *msk_45;
  float *src_45;
  float *pck_45;
  DoubleComplex *msk_44;
  longlong *src_44;
  longlong *pck_44;
  DoubleComplex *msk_43;
  long *src_43;
  long *pck_43;
  DoubleComplex *msk_42;
  int *src_42;
  int *pck_42;
  SingleComplex *msk_41;
  DoubleComplex *src_41;
  DoubleComplex *pck_41;
  SingleComplex *msk_40;
  SingleComplex *src_40;
  SingleComplex *pck_40;
  SingleComplex *msk_39;
  double *src_39;
  double *pck_39;
  SingleComplex *msk_38;
  float *src_38;
  float *pck_38;
  SingleComplex *msk_37;
  longlong *src_37;
  longlong *pck_37;
  SingleComplex *msk_36;
  long *src_36;
  long *pck_36;
  SingleComplex *msk_35;
  int *src_35;
  int *pck_35;
  double *msk_34;
  DoubleComplex *src_34;
  DoubleComplex *pck_34;
  double *msk_33;
  SingleComplex *src_33;
  SingleComplex *pck_33;
  double *msk_32;
  double *src_32;
  double *pck_32;
  double *msk_31;
  float *src_31;
  float *pck_31;
  double *msk_30;
  longlong *src_30;
  longlong *pck_30;
  double *msk_29;
  long *src_29;
  long *pck_29;
  double *msk_28;
  int *src_28;
  int *pck_28;
  float *msk_27;
  DoubleComplex *src_27;
  DoubleComplex *pck_27;
  float *msk_26;
  SingleComplex *src_26;
  SingleComplex *pck_26;
  float *msk_25;
  double *src_25;
  double *pck_25;
  float *msk_24;
  float *src_24;
  float *pck_24;
  float *msk_23;
  longlong *src_23;
  longlong *pck_23;
  float *msk_22;
  long *src_22;
  long *pck_22;
  float *msk_21;
  int *src_21;
  int *pck_21;
  longlong *msk_20;
  DoubleComplex *src_20;
  DoubleComplex *pck_20;
  longlong *msk_19;
  SingleComplex *src_19;
  SingleComplex *pck_19;
  longlong *msk_18;
  double *src_18;
  double *pck_18;
  longlong *msk_17;
  float *src_17;
  float *pck_17;
  longlong *msk_16;
  longlong *src_16;
  longlong *pck_16;
  longlong *msk_15;
  long *src_15;
  long *pck_15;
  longlong *msk_14;
  int *src_14;
  int *pck_14;
  long *msk_13;
  DoubleComplex *src_13;
  DoubleComplex *pck_13;
  long *msk_12;
  SingleComplex *src_12;
  SingleComplex *pck_12;
  long *msk_11;
  double *src_11;
  double *pck_11;
  long *msk_10;
  float *src_10;
  float *pck_10;
  long *msk_9;
  longlong *src_9;
  longlong *pck_9;
  long *msk_8;
  long *src_8;
  long *pck_8;
  long *msk_7;
  int *src_7;
  int *pck_7;
  int *msk_6;
  DoubleComplex *src_6;
  DoubleComplex *pck_6;
  int *msk_5;
  SingleComplex *src_5;
  SingleComplex *pck_5;
  int *msk_4;
  double *src_4;
  double *pck_4;
  int *msk_3;
  float *src_3;
  float *pck_3;
  int *msk_2;
  longlong *src_2;
  longlong *pck_2;
  int *msk_1;
  long *src_1;
  long *pck_1;
  int *msk;
  int *src;
  int *pck;
  Integer pck_idx;
  Integer i;
  Integer combined_type;
  long local_48;
  DoubleComplex *msk_48;
  DoubleComplex *src_48;
  DoubleComplex *pck_48;
  DoubleComplex *msk_47;
  SingleComplex *src_47;
  SingleComplex *pck_47;
  DoubleComplex *msk_46;
  double *src_46;
  
  local_48 = 0;
  msk_48 = in_RDI;
  switch(in_RCX * 0x11 + in_R8) {
  case 0x4662:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4663:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4664:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4665:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4667:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4668:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4671:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4673:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4674:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4675:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4676:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4678:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4679:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4682:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4684:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4685:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4686:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4687:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4689:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x468a:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4693:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)((long)&msk_45->real + local_48 * 4) =
             *(undefined4 *)(in_R9 + (long)msk_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4695:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4696:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4697:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4698:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x469a:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x469b:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46a4:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b7:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b8:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46b9:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ba:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46bc:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46bd:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c6:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        *(undefined4 *)(&msk_45->real + local_48) = *(undefined4 *)(in_R9 + (long)msk_48 * 8);
        *(undefined4 *)((long)&msk_45->real + local_48 * 8 + 4) =
             *(undefined4 *)(in_R9 + 4 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c8:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46c9:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ca:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46cb:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46cd:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46ce:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x46d7:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        msk_45[local_48].real = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10);
        msk_45[local_48].imag = *(DoublePrecision *)(in_R9 + (long)msk_48 * 0x10 + 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4761:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (src_45[(long)msk_48] != 0.0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4762:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4763:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((src_45[(long)msk_48] != 0.0) || (NAN(src_45[(long)msk_48]))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4764:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((*(double *)(src_45 + (long)msk_48 * 2) != 0.0) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4766:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (((src_45[(long)msk_48 * 2] != 0.0) || (NAN(src_45[(long)msk_48 * 2]))) ||
         ((src_45[(long)msk_48 * 2 + 1] != 0.0 || (NAN(src_45[(long)msk_48 * 2 + 1]))))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4767:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if ((((*(double *)(src_45 + (long)msk_48 * 4) != 0.0) ||
           (NAN(*(double *)(src_45 + (long)msk_48 * 4)))) ||
          (*(double *)(src_45 + (long)msk_48 * 4 + 2) != 0.0)) ||
         (NAN(*(double *)(src_45 + (long)msk_48 * 4 + 2)))) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
    break;
  case 0x4770:
    for (; (long)msk_48 < in_RDX && local_48 < in_RSI;
        msk_48 = (DoubleComplex *)((long)&msk_48->real + 1)) {
      if (*(long *)(src_45 + (long)msk_48 * 2) != 0) {
        (&msk_45->real)[local_48] = *(DoublePrecision *)(in_R9 + (long)msk_48 * 8);
        local_48 = local_48 + 1;
      }
    }
  }
  return;
}

Assistant:

static void sga_pack(Integer first, long lim, Integer elems,
                     Integer type_src, Integer type_msk,
                     void *ptr_src, void *ptr_dst, void *ptr_msk)
{
    Integer combined_type, i, pck_idx=0;
    combined_type = MT_NUMTYPES*type_src + type_msk;
    switch (combined_type) {
#define TYPE_CASE(MT,T,AT,MT_MSK,T_MSK,AT_MSK)                          \
        case (MT_NUMTYPES*MT) + MT_MSK:                                 \
            {                                                           \
                T * restrict pck = (T*)ptr_dst;                         \
                T * restrict src = (T*)ptr_src;                         \
                T_MSK * restrict msk = (T_MSK*)ptr_msk;                 \
                for (i=first; i<elems&&pck_idx<lim; i++) {              \
                    if (neq_zero_##AT_MSK(msk[i])) {                    \
                        assign_##AT(pck[pck_idx], src[i]);              \
                        ++pck_idx;                                      \
                    }                                                   \
                }                                                       \
                break;                                                  \
            }
#include "types2.xh"
#undef TYPE_CASE
    }
}